

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O2

void __thiscall cm::String::String(String *this,char *d,size_type s)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,d,d + s);
  String<std::__cxx11::string,void>(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

String(const char* d, size_type s)
    : String(std::string(d, s))
  {
  }